

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O2

string * generate_page_buttons_abi_cxx11_(string *__return_storage_ptr__,LadderDatabase *db)

{
  long lVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_t local_40;
  ulong local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = RenX::LadderDatabase::getEntries();
  local_40 = pluginInstance.entries_per_page;
  local_60._M_dataplus._M_p = (pointer)0x1d;
  local_60._M_string_length = 0x11270d;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
  lVar1 = 1;
  for (uVar2 = 0; uVar2 < local_38; uVar2 = uVar2 + local_40) {
    local_60._M_dataplus._M_p = (pointer)0x2f;
    local_60._M_string_length = 0x11272b;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
    string_printf_abi_cxx11_(&local_60,"%u",uVar2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (RenX::default_ladder_database != db) {
      local_60._M_dataplus._M_p = (pointer)0xa;
      local_60._M_string_length = 0x11275e;
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
      local_60._0_16_ = RenX::LadderDatabase::getName();
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
    }
    local_60._M_dataplus._M_p = (pointer)0x2;
    local_60._M_string_length = 0x112728;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
    string_printf_abi_cxx11_(&local_60,"%u",lVar1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    local_60._M_dataplus._M_p = (pointer)0xb;
    local_60._M_string_length = 0x112769;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
    lVar1 = lVar1 + 1;
  }
  local_60._M_dataplus._M_p = (pointer)0x6;
  local_60._M_string_length = 0x112775;
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string generate_page_buttons(RenX::LadderDatabase *db) {
	std::string result;
	size_t entry_count = db->getEntries();
	size_t entries_per_page = pluginInstance.getEntriesPerPage();

	result = R"html(<div id="leaderboard-paging">)html"sv;

	size_t entry_index = 0, page_index = 1;
	while (entry_index < entry_count) {
		// Add page
		result += R"html(<span class="leaderboard-page"><a href="?start=)html"sv;
		result += string_printf("%u", entry_index);
		if (db != RenX::default_ladder_database) {
			result += "&database="sv;
			result += db->getName();
		}
		result += R"html(">)html"sv;
		result += string_printf("%u", page_index);
		result += R"html(</a></span>)html"sv;

		// Increment indexes
		entry_index += entries_per_page;
		++page_index;
	}

	result += R"html(</div>)html"sv;
	return result;
}